

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Input.cpp
# Opt level: O0

void __thiscall Type1Input::~Type1Input(Type1Input *this)

{
  Type1Input *this_local;
  
  (this->super_Type1InterpreterImplementationAdapter).super_IType1InterpreterImplementation.
  _vptr_IType1InterpreterImplementation = (_func_int **)&PTR_Type1Hstem_0054f588;
  FreeTables(this);
  InputPFBDecodeStream::~InputPFBDecodeStream(&this->mPFBDecoder);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>_>_>
  ::~map(&this->mCharStrings);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ::~map(&this->mReverseEncoding);
  Type1Encoding::~Type1Encoding(&this->mEncoding);
  Type1PrivateDictionary::~Type1PrivateDictionary(&this->mPrivateDictionary);
  Type1FontInfoDictionary::~Type1FontInfoDictionary(&this->mFontInfoDictionary);
  Type1FontDictionary::~Type1FontDictionary(&this->mFontDictionary);
  return;
}

Assistant:

Type1Input::~Type1Input(void)
{
	FreeTables();
}